

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int iVar1;
  wchar_t *__dest;
  undefined1 *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char_type buffer [13];
  undefined8 uStack_60;
  undefined1 auStack_58 [64];
  
  iVar1 = *(int *)(this + 4);
  lVar10 = (long)iVar1;
  if (lVar10 < 0) {
    uStack_60 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                ::write_double<double>;
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = wchar_t, UInt = unsigned int, Iterator = wchar_t *, ThousandsSep = fmt::internal::add_thousands_sep<wchar_t>]"
                 );
  }
  __dest = *it;
  uVar5 = *(uint *)this;
  uVar6 = (ulong)uVar5;
  puVar2 = auStack_58 + lVar10 * 4;
  if (uVar6 < 100) {
    if (uVar5 < 10) goto LAB_001a3755;
    uVar7 = uVar6 * 2;
    *(int *)(auStack_58 + lVar10 * 4 + -4) =
         (int)(char)internal::basic_data<void>::DIGITS[uVar6 * 2 + 1];
LAB_001a376c:
    puVar2 = puVar2 + -4;
  }
  else {
    iVar8 = 0;
    do {
      uVar7 = uVar6;
      uVar3 = (uint)uVar7;
      uVar5 = (uint)(uVar7 / 100);
      iVar4 = (int)(uVar7 / 100);
      uVar6 = (ulong)((uVar3 + iVar4 * -100) * 2);
      *(int *)(puVar2 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar6 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(undefined4 *)(puVar2 + -8) = *(undefined4 *)(this + 8);
        *(int *)(puVar2 + -0xc) = (int)(char)internal::basic_data<void>::DIGITS[uVar6];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar9 = -0x10;
          goto LAB_001a3705;
        }
        puVar2 = puVar2 + -0xc;
      }
      else {
        *(int *)(puVar2 + -8) = (int)(char)internal::basic_data<void>::DIGITS[uVar6];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar9 = -0xc;
LAB_001a3705:
          *(undefined4 *)(puVar2 + lVar9) = *(undefined4 *)(this + 8);
          puVar2 = puVar2 + lVar9;
        }
        else {
          puVar2 = puVar2 + -8;
        }
      }
      iVar8 = iVar8 + 2;
      uVar6 = uVar7 / 100;
    } while (9999 < uVar3);
    if (uVar3 < 1000) {
LAB_001a3755:
      uVar5 = uVar5 | 0x30;
      goto LAB_001a377d;
    }
    uVar7 = (ulong)(uint)(iVar4 + (int)(uVar7 / 100));
    *(int *)(puVar2 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar7 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_001a376c;
    *(undefined4 *)(puVar2 + -8) = *(undefined4 *)(this + 8);
    puVar2 = puVar2 + -8;
  }
  uVar5 = (uint)(char)internal::basic_data<void>::DIGITS[uVar7 & 0xffffffff];
LAB_001a377d:
  *(uint *)(puVar2 + -4) = uVar5;
  if (iVar1 != 0) {
    uStack_60 = (code *)0x1a3799;
    memcpy(__dest,auStack_58,lVar10 * 4);
  }
  *it = __dest + lVar10;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }